

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcodec_service.c
# Opt level: O0

MPP_RET vcodec_service_reg_wr(void *ctx,MppDevRegWrCfg *cfg)

{
  RK_U32 *pRVar1;
  VcodecRegCfg *send_cfg;
  MppDevVcodecService *p;
  MppDevRegWrCfg *cfg_local;
  void *ctx_local;
  
  pRVar1 = (RK_U32 *)((long)ctx + (long)*(int *)((long)ctx + 0x1c) * 0xa0 + 0x28);
  if ((cfg->offset != 0) &&
     (_mpp_log_l(2,"vcodec_service","Assertion %s failed at %s:%d\n",(char *)0x0,"cfg->offset == 0",
                 "vcodec_service_reg_wr",0x255), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  *(void **)(pRVar1 + 0x24) = cfg->reg;
  *pRVar1 = cfg->size;
  if (*(RK_U32 *)((long)ctx + 0x18) != cfg->size) {
    _mpp_log_l(2,"vcodec_service","reg size mismatch wr %d rd %d\n","vcodec_service_reg_wr",
               (ulong)*(uint *)((long)ctx + 0x18),(ulong)cfg->size);
  }
  return MPP_OK;
}

Assistant:

MPP_RET vcodec_service_reg_wr(void *ctx, MppDevRegWrCfg *cfg)
{
    MppDevVcodecService *p = (MppDevVcodecService *)ctx;
    VcodecRegCfg *send_cfg = &p->regs[p->reg_send_idx];

    mpp_assert(cfg->offset == 0);
    send_cfg->reg_set = cfg->reg;
    send_cfg->reg_size = cfg->size;

    if (p->reg_size != cfg->size)
        mpp_err_f("reg size mismatch wr %d rd %d\n",
                  p->reg_size, cfg->size);

    return MPP_OK;
}